

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_3dm_settings.cpp
# Opt level: O2

void __thiscall
ON_3dmAnnotationSettings::SetDimensionLayerId
          (ON_3dmAnnotationSettings *this,ON_UUID *dimension_layer_id)

{
  undefined8 uVar1;
  unsigned_short uVar2;
  unsigned_short uVar3;
  bool bVar4;
  ON_3dmAnnotationSettingsPrivate *pOVar5;
  ON_UUID local_20;
  
  if (this != &Default) {
    local_20 = DimensionLayerId(this);
    bVar4 = ::operator!=(&local_20,dimension_layer_id);
    if (bVar4) {
      pOVar5 = this->m_private;
      if (pOVar5 == (ON_3dmAnnotationSettingsPrivate *)0x0) {
        pOVar5 = (ON_3dmAnnotationSettingsPrivate *)operator_new(0x1c);
        pOVar5->m_world_view_text_scale = 0.0;
        pOVar5->m_world_view_hatch_scale = 0.0;
        pOVar5->m_use_dimension_layer = false;
        *(undefined3 *)&pOVar5->field_0x9 = 0;
        (pOVar5->m_dimension_layer_id).Data1 = 0;
        pOVar5->m_world_view_text_scale = 1.0;
        pOVar5->m_world_view_hatch_scale = 1.0;
        (pOVar5->m_dimension_layer_id).Data1 = 0;
        (pOVar5->m_dimension_layer_id).Data2 = 0;
        (pOVar5->m_dimension_layer_id).Data3 = 0;
        (pOVar5->m_dimension_layer_id).Data4[0] = '\0';
        (pOVar5->m_dimension_layer_id).Data4[1] = '\0';
        (pOVar5->m_dimension_layer_id).Data4[2] = '\0';
        (pOVar5->m_dimension_layer_id).Data4[3] = '\0';
        (pOVar5->m_dimension_layer_id).Data4[4] = '\0';
        (pOVar5->m_dimension_layer_id).Data4[5] = '\0';
        (pOVar5->m_dimension_layer_id).Data4[6] = '\0';
        (pOVar5->m_dimension_layer_id).Data4[7] = '\0';
        this->m_private = pOVar5;
      }
      uVar2 = dimension_layer_id->Data2;
      uVar3 = dimension_layer_id->Data3;
      uVar1 = *(undefined8 *)dimension_layer_id->Data4;
      (pOVar5->m_dimension_layer_id).Data1 = dimension_layer_id->Data1;
      (pOVar5->m_dimension_layer_id).Data2 = uVar2;
      (pOVar5->m_dimension_layer_id).Data3 = uVar3;
      *(undefined8 *)(pOVar5->m_dimension_layer_id).Data4 = uVar1;
    }
  }
  return;
}

Assistant:

void ON_3dmAnnotationSettings::SetDimensionLayerId(const ON_UUID& dimension_layer_id)
{
  if (this == &ON_3dmAnnotationSettings::Default)
    return;
  if (DimensionLayerId() != dimension_layer_id)
  {
    if (nullptr == m_private)
      m_private = new ON_3dmAnnotationSettingsPrivate();
    m_private->m_dimension_layer_id = dimension_layer_id;
  }
}